

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  FieldDescriptor *descriptor;
  Descriptor *descriptor_00;
  ImmutableMessageGenerator local_b0;
  int local_70;
  int i_1;
  ImmutableExtensionGenerator local_60;
  int local_1c;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  local_1c = 0;
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = Descriptor::extension_count((this->super_MessageGenerator).descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor = Descriptor::extension((this->super_MessageGenerator).descriptor_,local_1c);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator(&local_60,descriptor,this->context_);
    ImmutableExtensionGenerator::GenerateRegistrationCode(&local_60,pPStack_18);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator(&local_60);
    local_1c = local_1c + 1;
  }
  local_70 = 0;
  while( true ) {
    iVar1 = local_70;
    iVar2 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor_00 = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_70);
    ImmutableMessageGenerator(&local_b0,descriptor_00,this->context_);
    GenerateExtensionRegistrationCode(&local_b0,pPStack_18);
    ~ImmutableMessageGenerator(&local_b0);
    local_70 = local_70 + 1;
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateExtensionRegistrationCode(io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
      .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
      .GenerateExtensionRegistrationCode(printer);
  }
}